

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall
QTableViewPrivate::nextActiveVisualRow
          (QTableViewPrivate *this,int rowToStart,int column,int limit,
          SearchDirection searchDirection)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int in_ECX;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int visualRow;
  int lc;
  anon_class_8_1_8991fb9c isCellActive;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  int local_38;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  logicalColumn((QTableViewPrivate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac);
  local_38 = in_ESI;
  if (in_R8D == 0) {
    if (in_ESI < in_ECX) {
      uVar4 = 0;
      do {
        bVar3 = nextActiveVisualRow::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        if (((bVar3 ^ 0xffU) & 1) == 0) goto LAB_008b3d8c;
        local_38 = local_38 + 1;
        local_14 = in_ESI;
      } while (local_38 != in_ECX);
      goto LAB_008b3d94;
    }
  }
  else if (in_R8D == 1) {
    uVar4 = 1;
    while( true ) {
      bVar2 = 0;
      if (in_ECX < local_38) {
        bVar3 = nextActiveVisualRow::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        bVar2 = bVar3 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      local_38 = local_38 + -1;
    }
  }
LAB_008b3d8c:
  local_14 = local_38;
LAB_008b3d94:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

int QTableViewPrivate::nextActiveVisualRow(int rowToStart, int column, int limit,
                                           SearchDirection searchDirection) const
{
    const int lc = logicalColumn(column);
    int visualRow = rowToStart;
    const auto isCellActive = [this](int vr, int lc)
    {
        const int lr = logicalRow(vr);
        return !isRowHidden(lr) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        if (visualRow < limit) {
            while (!isCellActive(visualRow, lc)) {
                if (++visualRow == limit)
                    return rowToStart;
            }
        }
        break;
    case SearchDirection::Decreasing:
        while (visualRow > limit && !isCellActive(visualRow, lc))
            --visualRow;
        break;
    }
    return visualRow;
}